

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::makeMove(Board *this,size_t srcRow,size_t srcCol,size_t dstRow,size_t dstCol)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->values,dstRow * this->sizeInt + dstCol);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->values,srcRow * this->sizeInt + srcCol);
  vVar1 = *pvVar2;
  *pvVar2 = *pvVar3;
  *pvVar3 = vVar1;
  return;
}

Assistant:

void Board::makeMove( size_t srcRow, size_t srcCol, size_t dstRow, size_t dstCol )
{
    std::swap( values.at( dstRow * sizeInt + dstCol ), values.at( srcRow * sizeInt + srcCol ));
}